

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libauthretry.c
# Opt level: O0

int test(char *url)

{
  int iVar1;
  long auth_scheme;
  long auth_scheme_00;
  long fallback_auth_scheme;
  long main_auth_scheme;
  CURL *curl;
  CURLcode res;
  char *url_local;
  
  auth_scheme = parse_auth_name(libtest_arg2);
  auth_scheme_00 = parse_auth_name(libtest_arg3);
  if ((auth_scheme == 0) || (auth_scheme_00 == 0)) {
    curl_mfprintf(_stderr,"auth schemes not found on commandline\n");
    url_local._4_4_ = CURLE_USE_SSL_FAILED|CURLE_LDAP_INVALID_URL;
  }
  else {
    iVar1 = curl_global_init(3);
    if (iVar1 == 0) {
      main_auth_scheme = curl_easy_init();
      if ((CURL *)main_auth_scheme == (CURL *)0x0) {
        curl_mfprintf(_stderr,"curl_easy_init() failed\n");
        curl_global_cleanup();
        url_local._4_4_ = CURLE_USE_SSL_FAILED|CURLE_LDAP_INVALID_URL;
      }
      else {
        curl._4_4_ = send_wrong_password((CURL *)main_auth_scheme,url,100,auth_scheme);
        if ((curl._4_4_ == CURLE_OK) &&
           (curl._4_4_ = send_right_password((CURL *)main_auth_scheme,url,200,auth_scheme_00),
           curl._4_4_ == CURLE_OK)) {
          curl_easy_cleanup(main_auth_scheme);
          main_auth_scheme = curl_easy_init();
          if ((CURL *)main_auth_scheme == (CURL *)0x0) {
            curl_mfprintf(_stderr,"curl_easy_init() failed\n");
            curl_global_cleanup();
            return 0x7e;
          }
          curl._4_4_ = send_wrong_password((CURL *)main_auth_scheme,url,300,auth_scheme);
          if ((curl._4_4_ == CURLE_OK) &&
             (curl._4_4_ = send_wrong_password((CURL *)main_auth_scheme,url,400,auth_scheme_00),
             curl._4_4_ == CURLE_OK)) {
            curl._4_4_ = send_right_password((CURL *)main_auth_scheme,url,500,auth_scheme_00);
          }
        }
        curl_easy_cleanup(main_auth_scheme);
        curl_global_cleanup();
        url_local._4_4_ = curl._4_4_;
      }
    }
    else {
      curl_mfprintf(_stderr,"curl_global_init() failed\n");
      url_local._4_4_ = CURLE_USE_SSL_FAILED|CURLE_LDAP_INVALID_URL;
    }
  }
  return url_local._4_4_;
}

Assistant:

int test(char *url)
{
  CURLcode res;
  CURL *curl = NULL;

  long main_auth_scheme = parse_auth_name(libtest_arg2);
  long fallback_auth_scheme = parse_auth_name(libtest_arg3);

  if(main_auth_scheme == CURLAUTH_NONE ||
      fallback_auth_scheme == CURLAUTH_NONE) {
    fprintf(stderr, "auth schemes not found on commandline\n");
    return TEST_ERR_MAJOR_BAD;
  }

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  /* Send wrong password, then right password */

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  res = send_wrong_password(curl, url, 100, main_auth_scheme);
  if(res != CURLE_OK)
    goto test_cleanup;

  res = send_right_password(curl, url, 200, fallback_auth_scheme);
  if(res != CURLE_OK)
    goto test_cleanup;

  curl_easy_cleanup(curl);

  /* Send wrong password twice, then right password */
  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  res = send_wrong_password(curl, url, 300, main_auth_scheme);
  if(res != CURLE_OK)
    goto test_cleanup;

  res = send_wrong_password(curl, url, 400, fallback_auth_scheme);
  if(res != CURLE_OK)
    goto test_cleanup;

  res = send_right_password(curl, url, 500, fallback_auth_scheme);
  if(res != CURLE_OK)
    goto test_cleanup;

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}